

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

PtexTexture * __thiscall
Ptex::v2_2::PtexReaderCache::get(PtexReaderCache *this,char *filename,String *error)

{
  size_t *psVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  PtexCachedReader *reader;
  PtexCachedReader *value;
  PtexCachedReader *pPVar5;
  char *pcVar6;
  bool bVar7;
  char *pathToOpen;
  string buffer;
  StringKey key;
  char *local_70;
  string local_68;
  StringKey local_48;
  
  StringKey::StringKey(&local_48,filename);
  reader = PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::get
                     (&this->_files,&local_48);
  if (reader == (PtexCachedReader *)0x0) {
    value = (PtexCachedReader *)operator_new(0x310);
    PtexReader::PtexReader((PtexReader *)value,this->_premultiply,this->_io,this->_err);
    (value->super_PtexReader).super_PtexTexture._vptr_PtexTexture =
         (_func_int **)&PTR__PtexReader_0012d2c8;
    value->_cache = this;
    value->_refCount = 1;
    value->_memUsedAccountedFor = 0;
    value->_opensAccountedFor = 0;
    value->_blockReadsAccountedFor = 0;
    (value->_openFilesItem)._prev = &value->_openFilesItem;
    (value->_openFilesItem)._next = &value->_openFilesItem;
    (value->_activeFilesItem)._prev = &value->_activeFilesItem;
    (value->_activeFilesItem)._next = &value->_activeFilesItem;
LAB_0010ecd3:
    bVar7 = (value->super_PtexReader)._needToOpen;
    if (bVar7 == true) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_70 = filename;
      if ((this->_io != (PtexInputHandler *)0x0) ||
         (bVar4 = findFile(this,&local_70,&local_68,error), bVar4)) {
        PtexReader::open(&value->super_PtexReader,local_70,(int)error);
      }
      else {
        (value->super_PtexReader)._ok = false;
        (value->super_PtexReader)._needToOpen = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
    }
    pPVar5 = value;
    if (reader == (PtexCachedReader *)0x0) {
      local_68._M_dataplus._M_p = (pointer)0x0;
      pPVar5 = PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::tryInsert
                         (&this->_files,&local_48,value,(size_t *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        LOCK();
        psVar1 = &this->_memUsed;
        sVar2 = *psVar1;
        *psVar1 = (size_t)(local_68._M_dataplus._M_p + *psVar1);
        UNLOCK();
        pcVar6 = local_68._M_dataplus._M_p + sVar2;
        if (local_68._M_dataplus._M_p + sVar2 < (char *)this->_peakMemUsed) {
          pcVar6 = (char *)this->_peakMemUsed;
        }
        this->_peakMemUsed = (size_t)pcVar6;
      }
      if (pPVar5 != value) {
        do {
          do {
            iVar3 = pPVar5->_refCount;
          } while (iVar3 < 0);
          LOCK();
          bVar4 = iVar3 == pPVar5->_refCount;
          if (bVar4) {
            pPVar5->_refCount = iVar3 + 1;
          }
          UNLOCK();
        } while (!bVar4);
        (*(value->super_PtexReader).super_PtexTexture._vptr_PtexTexture[1])(value);
      }
    }
    if ((pPVar5->super_PtexReader)._ok != false) {
      if (bVar7 != false) {
        LOCK();
        psVar1 = &(pPVar5->super_PtexReader)._opens;
        *psVar1 = *psVar1 + 1;
        UNLOCK();
      }
      goto LAB_0010ede9;
    }
    LOCK();
    pPVar5->_refCount = pPVar5->_refCount + -1;
    UNLOCK();
  }
  else if ((reader->super_PtexReader)._ok != false) {
    if ((reader->super_PtexReader)._pendingPurge == true) {
      purge(this,reader);
    }
    do {
      do {
        iVar3 = reader->_refCount;
      } while (iVar3 < 0);
      LOCK();
      bVar7 = iVar3 == reader->_refCount;
      if (bVar7) {
        reader->_refCount = iVar3 + 1;
      }
      UNLOCK();
      value = reader;
    } while (!bVar7);
    goto LAB_0010ecd3;
  }
  pPVar5 = (PtexCachedReader *)0x0;
LAB_0010ede9:
  if ((local_48._ownsVal == true) && (local_48._val != (char *)0x0)) {
    operator_delete__(local_48._val);
  }
  return (PtexTexture *)pPVar5;
}

Assistant:

PtexTexture* PtexReaderCache::get(const char* filename, Ptex::String& error)
{
    // lookup reader in map
    StringKey key(filename);
    PtexCachedReader* reader = _files.get(key);
    bool isNew = false;

    if (reader) {
        if (!reader->ok()) return 0;
        if (reader->pendingPurge()) {
            // a previous purge attempt was made and file was busy.  Try again now.
            purge(reader);
        }
        reader->ref();
    } else {
        reader = new PtexCachedReader(_premultiply, _io, _err, this);
        isNew = true;
    }

    bool needOpen = reader->needToOpen();
    if (needOpen) {
        std::string buffer;
        const char* pathToOpen = filename;
        // search for the file (unless we have an I/O handler)
        if (_io || findFile(pathToOpen, buffer, error)) {
            reader->open(pathToOpen, error);
        } else {
            // flag reader as invalid so we don't try to open it again on next lookup
            reader->invalidate();
        }
    }

    if (isNew) {
        size_t newMemUsed = 0;
        PtexCachedReader* newreader = reader;
        reader = _files.tryInsert(key, reader, newMemUsed);
        adjustMemUsed(newMemUsed);
        if (reader != newreader) {
            // another thread got here first
            reader->ref();
            delete newreader;
        }
    }

    if (!reader->ok()) {
        reader->unref();
        return 0;
    }

    if (needOpen) {
        reader->logOpen();
    }

    return reader;
}